

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O2

void __thiscall Response::Response(Response *this,Request *request,path *resolve_path)

{
  Status *this_00;
  bool bVar1;
  char cVar2;
  long lVar3;
  size_t sVar4;
  Response *this_01;
  path filepath;
  string local_298;
  string local_278;
  string local_258;
  Response local_238 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"HTTP/1.1",(allocator<char> *)local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->server,"Apache/2.2.8 (Ubuntu) mod_ssl/2.2.8 OpenSSL/0.9.8g",
             (allocator<char> *)local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->connection,"close",(allocator<char> *)local_238);
  this->content_length = 0;
  this_00 = &this->status;
  Status::Status(this_00,200);
  get_date_abi_cxx11_();
  (this->content_type)._M_dataplus._M_p = (pointer)&(this->content_type).field_2;
  (this->content_type)._M_string_length = 0;
  (this->content_type).field_2._M_local_buf[0] = '\0';
  (this->body).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->body).
  super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string((string *)&local_258,(string *)&request->path);
  prepare_url(&filepath._M_pathname,this,&local_258);
  std::filesystem::__cxx11::path::path((path *)local_238,&filepath._M_pathname,auto_format);
  std::filesystem::__cxx11::path::operator+=(resolve_path,(path *)local_238);
  std::filesystem::__cxx11::path::~path((path *)local_238);
  std::__cxx11::string::~string((string *)&filepath);
  std::__cxx11::string::~string((string *)&local_258);
  std::filesystem::__cxx11::path::path(&filepath,resolve_path);
  lVar3 = std::__cxx11::string::find((char *)&request->path,0x10963a);
  if (lVar3 == -1) {
    bVar1 = std::filesystem::exists(&filepath);
    if (bVar1) {
      cVar2 = std::filesystem::__cxx11::path::has_filename();
      if (cVar2 == '\0') {
        std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                  ((path *)local_238,(char (*) [11])"index.html",auto_format);
        std::filesystem::__cxx11::path::replace_filename(&filepath);
        std::filesystem::__cxx11::path::~path((path *)local_238);
      }
      bVar1 = std::filesystem::exists(&filepath);
      if (bVar1) {
        bVar1 = std::operator!=(&request->method,"HEAD");
        if (bVar1) {
          bVar1 = std::operator!=(&request->method,"GET");
          if (bVar1) {
            Status::Status((Status *)local_238,0x195);
            goto LAB_001076a2;
          }
        }
        sVar4 = std::filesystem::file_size(&filepath);
        this->content_length = sVar4;
        Status::Status((Status *)local_238,200);
        Status::operator=(this_00,(Status *)local_238);
        std::__cxx11::string::~string((string *)local_238);
        std::filesystem::__cxx11::path::extension((path *)local_238,&filepath);
        this_01 = local_238;
        std::__cxx11::string::string((string *)&local_278,(string *)this_01);
        parse_mime(&local_298,this_01,&local_278);
        std::__cxx11::string::operator=((string *)&this->content_type,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_278);
        std::filesystem::__cxx11::path::~path((path *)local_238);
        bVar1 = std::operator==(&request->method,"GET");
        if (bVar1) {
          std::ifstream::ifstream(local_238,filepath._M_pathname._M_dataplus._M_p,_S_in);
          std::make_shared<std::ifstream,std::ifstream>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&local_298);
          std::__shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<std::istream,(__gnu_cxx::_Lock_policy)2> *)&this->body,
                     (__shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&local_298);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
          std::ifstream::~ifstream(local_238);
        }
        goto LAB_001076bd;
      }
      Status::Status((Status *)local_238,0x193);
    }
    else {
      Status::Status((Status *)local_238,0x194);
    }
  }
  else {
    Status::Status((Status *)local_238,0x193);
  }
LAB_001076a2:
  Status::operator=(this_00,(Status *)local_238);
  std::__cxx11::string::~string((string *)local_238);
LAB_001076bd:
  std::filesystem::__cxx11::path::~path(&filepath);
  return;
}

Assistant:

Response::Response(const Request& request, fs::path resolve_path) :
            protocol("HTTP/1.1"),
            server("Apache/2.2.8 (Ubuntu) mod_ssl/2.2.8 OpenSSL/0.9.8g"),
            connection("close"),
            content_length(0),
            date(get_date()),
            body(nullptr) {

    resolve_path += fs::path(prepare_url(request.path));
    fs::path filepath = resolve_path;

    if (request.path.find("../") != std::string::npos) {
        status = Response::Status(403);
        return;
    }
    if (!fs::exists(filepath)) {
        status = Response::Status(404);
        return;
    }

    if (!filepath.has_filename()) {
        filepath.replace_filename("index.html");
    } 
    if (!fs::exists(filepath)) {
        status = Response::Status(403);
        return;
    }

    if (request.method != "HEAD" && request.method != "GET") {
        status = Response::Status(405);
        return;
    }
    {   
        content_length = fs::file_size(filepath);
    }

    status = Response::Status(200);
    content_type = parse_mime(filepath.extension());
    if (request.method == "GET") {
        body = std::make_shared<std::ifstream>(std::ifstream(filepath));
        return;
    }
}